

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

uint * getRevealedNodes(tree_t *tree,uint16_t *hideList,size_t hideListSize,size_t *outputSize)

{
  uint *puVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  size_t len4;
  void *__ptr;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  uint local_64;
  
  uVar12 = tree->depth - 1;
  __ptr = calloc(uVar12 * hideListSize,4);
  if (hideListSize != 0) {
    iVar17 = tree->numNodes - tree->numLeaves;
    sVar8 = 0;
    do {
      uVar2 = hideList[sVar8];
      *(uint *)((long)__ptr + sVar8 * 4) = iVar17 + (uint)uVar2;
      uVar11 = iVar17 + 1 + (uint)uVar2 >> 1;
      iVar13 = uVar11 - 1;
      if (iVar13 != 0) {
        uVar14 = 1;
        do {
          *(int *)((long)__ptr + uVar14 * hideListSize * 4 + sVar8 * 4) = iVar13;
          uVar14 = uVar14 + 1;
          uVar11 = uVar11 >> 1;
          iVar13 = uVar11 - 1;
        } while (iVar13 != 0);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != hideListSize);
  }
  puVar4 = (uint *)malloc((ulong)tree->numLeaves << 2);
  if (uVar12 == 0) {
    sVar8 = 0;
  }
  else {
    uVar5 = hideListSize & 0xfffffffffffffffc;
    uVar10 = 0;
    local_64 = 0;
    pvVar16 = __ptr;
    do {
      if (hideListSize != 0) {
        uVar11 = tree->numNodes;
        sVar8 = 0;
        do {
          uVar14 = *(uint *)((long)__ptr + sVar8 * 4 + uVar10 * hideListSize * 4);
          if (((uVar14 < uVar11) &&
              ((tree->haveNodeExists[uVar14 * 2 >> 6] >> ((ulong)(uVar14 * 2) & 0x3f) & 1) != 0)) &&
             (((uVar14 & 1) == 0 ||
              ((uVar14 + 1 < uVar11 &&
               (uVar6 = (uVar14 + 1) * 2,
               (tree->haveNodeExists[uVar6 >> 6] >> (ulong)(uVar6 & 0x3c) & 1) != 0)))))) {
            uVar6 = uVar14 + 1;
            if (uVar11 <= uVar14 + 1) {
              uVar6 = 0;
            }
            if ((uVar14 & 1) == 0) {
              uVar6 = uVar14 - 1;
            }
            if (uVar5 == 0) {
              uVar9 = 0;
            }
            else {
              auVar20 = vpbroadcastd_avx512vl();
              uVar15 = 0;
              do {
                auVar3 = vpcmpeqd_avx(auVar20,*(undefined1 (*) [16])((long)pvVar16 + uVar15 * 4));
                if ((((auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar3[0xf] < '\0') goto LAB_00122b7e;
                uVar15 = uVar15 + 4;
                uVar9 = uVar5;
              } while (uVar15 < uVar5);
            }
            if (uVar9 < hideListSize) {
              do {
                uVar14 = *(uint *)((long)pvVar16 + uVar9 * 4);
                if (uVar14 == uVar6) break;
                bVar19 = hideListSize - 1 != uVar9;
                uVar9 = uVar9 + 1;
              } while (bVar19);
              if (uVar14 == uVar6) goto LAB_00122b7e;
            }
            do {
              uVar7 = uVar6;
              uVar14 = uVar7 * 2;
              if ((uVar7 < uVar11 && uVar7 * 2 + 2 < uVar11) &&
                 ((tree->haveNodeExists[uVar14 >> 6] >> (ulong)(uVar14 & 0x3e) & 1) != 0)) break;
              uVar6 = uVar14 | 1;
            } while ((uVar14 | 1) < uVar11);
            uVar15 = (ulong)local_64;
            uVar9 = uVar15 & 0xfffffffc;
            if ((local_64 & 0xfffffffc) == 0) {
              uVar9 = 0;
            }
            else {
              auVar20 = vpbroadcastd_avx512vl();
              uVar18 = 0;
              do {
                auVar3 = vpcmpeqd_avx(auVar20,*(undefined1 (*) [16])(puVar4 + uVar18));
                if ((((auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar3[0xf] < '\0') goto LAB_00122b7e;
                uVar18 = uVar18 + 4;
              } while (uVar18 < uVar9);
            }
            if (uVar9 < uVar15) {
              do {
                puVar1 = puVar4 + uVar9;
                if (*puVar1 == uVar7) break;
                bVar19 = uVar15 - 1 != uVar9;
                uVar9 = uVar9 + 1;
              } while (bVar19);
              if (*puVar1 == uVar7) goto LAB_00122b7e;
            }
            puVar4[uVar15] = uVar7;
            local_64 = local_64 + 1;
          }
LAB_00122b7e:
          sVar8 = sVar8 + 1;
        } while (sVar8 != hideListSize);
      }
      uVar10 = uVar10 + 1;
      pvVar16 = (void *)((long)pvVar16 + hideListSize * 4);
    } while (uVar10 != uVar12);
    sVar8 = (size_t)local_64;
  }
  free(__ptr);
  *outputSize = sVar8;
  return puVar4;
}

Assistant:

static unsigned int* getRevealedNodes(tree_t* tree, uint16_t* hideList, size_t hideListSize,
                                      size_t* outputSize) {
  /* Compute paths up from hideList to root, store as sets of nodes */
  const unsigned int pathLen = tree->depth - 1;

  /* pathSets[i][0...hideListSize] ~= pathSets[i * hideListSize + ...] stores the nodes in the path
   * at depth i for each of the leaf nodes in hideListSize */
  unsigned int* pathSets = calloc(hideListSize * pathLen, sizeof(unsigned int));

  /* Compute the paths back to the root */
  for (size_t i = 0; i < hideListSize; i++) {
    /* input lists leaf indexes, translate to nodes */
    unsigned int node                    = hideList[i] + (tree->numNodes - tree->numLeaves);
    pathSets[/* 0 * hideListSize + */ i] = node;
    unsigned int pos                     = 1;
    while ((node = getParent(node)) != 0) {
      pathSets[pos * hideListSize + i] = node;
      pos++;
    }
  }

  /* Determine seeds to reveal */
  unsigned int* revealed   = malloc(tree->numLeaves * sizeof(unsigned int));
  unsigned int revealedPos = 0;
  for (unsigned int d = 0; d < pathLen; d++) {
    for (size_t i = 0; i < hideListSize; i++) {
      unsigned int node = pathSets[d * hideListSize + i];
      if (!hasSibling(tree, node)) {
        continue;
      }
      unsigned int sibling = getSibling(tree, node);
      if (!contains(&pathSets[d * hideListSize], hideListSize, sibling)) {
        // Determine the seed to reveal
        while (!hasRightChild(tree, sibling) && !isLeafNode(tree, sibling)) {
          sibling = 2 * sibling + 1; // sibling = leftChild(sibling)
        }
        // Only reveal if we haven't already
        if (!contains(revealed, revealedPos, sibling)) {
          revealed[revealedPos] = sibling;
          revealedPos++;
        }
      }
    }
  }

  free(pathSets);

  *outputSize = revealedPos;
  return revealed;
}